

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# livevar_analyse.hpp
# Opt level: O0

void __thiscall optimization::livevar_analyse::Block_Live_Var::update(Block_Live_Var *this,int idx)

{
  insert_iterator<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>
  __result;
  int iVar1;
  size_type sVar2;
  size_type sVar3;
  pointer pIVar4;
  element_type *peVar5;
  int in_ESI;
  vector<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  *in_RDI;
  pair<std::_Rb_tree_const_iterator<mir::inst::VarId>,_bool> pVar7;
  insert_iterator<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>
  iVar8;
  insert_iterator<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>
  iVar9;
  VariableSet diff_result;
  VariableSet defvars;
  VarId defvar;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> useVars;
  int size_before;
  sharedPtrVariableSet tmp;
  VarId *in_stack_fffffffffffffdb8;
  iterator in_stack_fffffffffffffdc0;
  value_type *in_stack_fffffffffffffdd8;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  *in_stack_fffffffffffffde0;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  *in_stack_fffffffffffffdf8;
  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
  *in_stack_fffffffffffffe00;
  _Iter _Var10;
  _Rb_tree_const_iterator<mir::inst::VarId> __last2;
  _Rb_tree_const_iterator<mir::inst::VarId> __first2;
  _Rb_tree_node_base local_f8;
  _Base_ptr local_c8;
  undefined1 local_c0;
  _Base_ptr local_b8;
  undefined1 local_b0;
  _Rb_tree_node_base local_a8 [2];
  undefined1 local_58 [52];
  undefined4 local_24;
  _Rb_tree_node_base local_20;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *psVar6;
  
  if (-1 < in_ESI) {
    local_20._M_left._4_4_ = in_ESI;
    std::
    shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>
    ::shared_ptr((shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>
                  *)in_stack_fffffffffffffdc0._M_node,
                 (shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>
                  *)in_stack_fffffffffffffdb8);
    iVar1 = local_20._M_left._4_4_ + 1;
    sVar2 = std::
            vector<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
            ::size(in_RDI);
    if ((ulong)(long)iVar1 < sVar2) {
      std::
      vector<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
      ::operator[](in_RDI,(long)(local_20._M_left._4_4_ + 1));
      std::
      shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>
      ::operator=((shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>
                   *)in_stack_fffffffffffffdc0._M_node,
                  (shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>
                   *)in_stack_fffffffffffffdb8);
    }
    std::
    vector<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
    ::operator[](in_RDI,(long)local_20._M_left._4_4_);
    std::
    __shared_ptr_access<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x14fcf6);
    sVar3 = std::
            set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
            size((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                  *)0x14fcfe);
    local_24 = (undefined4)sVar3;
    std::
    vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
    ::operator[]((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                  *)(in_RDI[6].
                     super__Vector_base<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 4),(long)local_20._M_left._4_4_);
    pIVar4 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                       ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                        0x14fd30);
    (*(pIVar4->super_Displayable)._vptr_Displayable[2])(local_58);
    std::
    vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
    ::operator[]((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                  *)(in_RDI[6].
                     super__Vector_base<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 4),(long)local_20._M_left._4_4_);
    std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
              ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)0x14fd6e);
    mir::inst::VarId::VarId((VarId *)in_stack_fffffffffffffdc0._M_node,in_stack_fffffffffffffdb8);
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::set
              ((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                *)0x14fd8f);
    std::
    map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
    ::operator[](in_stack_fffffffffffffe00,(key_type_conflict *)in_stack_fffffffffffffdf8);
    peVar5 = std::__shared_ptr_access<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x14fdc6);
    iVar1 = (*(peVar5->super_Displayable)._vptr_Displayable[1])();
    if (iVar1 != 1) {
      std::
      vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ::operator[]((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                    *)(in_RDI[6].
                       super__Vector_base<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 4),(long)local_20._M_left._4_4_);
      pIVar4 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                         ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                          0x14fe13);
      iVar1 = (*(pIVar4->super_Displayable)._vptr_Displayable[1])();
      if (iVar1 != 4) {
        pVar7 = std::
                set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                ::insert(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        local_b8 = (_Base_ptr)pVar7.first._M_node;
        local_b0 = pVar7.second;
        std::
        __shared_ptr_access<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x14fe8d);
        pVar7 = std::
                set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                ::insert(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        local_c8 = (_Base_ptr)pVar7.first._M_node;
        local_c0 = pVar7.second;
      }
    }
    if (((ulong)in_RDI[6].
                super__Vector_base<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish & 1) != 0) {
      std::
      vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ::at((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            *)in_stack_fffffffffffffdc0._M_node,(size_type)in_stack_fffffffffffffdb8);
      pIVar4 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                         ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                          0x14ff42);
      iVar1 = (*(pIVar4->super_Displayable)._vptr_Displayable[1])();
      if (iVar1 == 7) {
        std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
        clear((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
               *)0x14ff6a);
        std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
        clear((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
               *)0x14ff77);
      }
    }
    __first2._M_node = &local_f8;
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::set
              ((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                *)0x14ff8b);
    std::
    vector<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
    ::operator[](in_RDI,(long)local_20._M_left._4_4_);
    std::
    __shared_ptr_access<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x14ffa8);
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
    clear((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *)
          0x14ffb0);
    _Var10._M_node = &local_20;
    std::
    __shared_ptr_access<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x14ffc2);
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
    begin((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *)
          in_stack_fffffffffffffdb8);
    std::
    __shared_ptr_access<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x14ffdc);
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::end
              ((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                *)in_stack_fffffffffffffdb8);
    __last2._M_node = local_a8;
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
    begin((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *)
          in_stack_fffffffffffffdb8);
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::end
              ((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                *)in_stack_fffffffffffffdb8);
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
    begin((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *)
          in_stack_fffffffffffffdb8);
    iVar8 = std::
            inserter<std::set<mir::inst::VarId,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>>
                      ((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                        *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdc0);
    iVar9.iter._M_node = _Var10._M_node;
    iVar9.container = in_stack_fffffffffffffdf8;
    iVar9 = std::
            set_difference<std::_Rb_tree_const_iterator<mir::inst::VarId>,std::_Rb_tree_const_iterator<mir::inst::VarId>,std::insert_iterator<std::set<mir::inst::VarId,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>>>
                      ((_Base_ptr)iVar8.container,(_Base_ptr)iVar8.iter._M_node,__first2,__last2,
                       iVar9);
    psVar6 = iVar9.container;
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
    begin((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *)
          in_stack_fffffffffffffdb8);
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::end
              ((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                *)in_stack_fffffffffffffdb8);
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
    begin((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *)
          in_stack_fffffffffffffdb8);
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::end
              ((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                *)in_stack_fffffffffffffdb8);
    std::
    vector<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
    ::operator[](in_RDI,(long)local_20._M_left._4_4_);
    std::
    __shared_ptr_access<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator*((__shared_ptr_access<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)in_stack_fffffffffffffdc0._M_node);
    std::
    vector<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
    ::operator[](in_RDI,(long)local_20._M_left._4_4_);
    std::
    __shared_ptr_access<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x150154);
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
    begin((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *)
          in_stack_fffffffffffffdb8);
    std::
    inserter<std::set<mir::inst::VarId,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>>
              ((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdc0);
    __result.iter._M_node = _Var10._M_node;
    __result.container = psVar6;
    std::
    set_union<std::_Rb_tree_const_iterator<mir::inst::VarId>,std::_Rb_tree_const_iterator<mir::inst::VarId>,std::insert_iterator<std::set<mir::inst::VarId,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>>>
              ((_Base_ptr)iVar8.container,(_Base_ptr)iVar8.iter._M_node,__first2,__last2,__result);
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::~set
              ((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                *)0x150202);
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::~set
              ((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                *)0x15020f);
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::~set
              ((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                *)0x15021c);
    std::
    shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>
    ::~shared_ptr((shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>
                   *)0x150229);
  }
  return;
}

Assistant:

void update(int idx) {
    if (idx < 0) {
      return;
    }
    auto tmp = live_vars_out;
    if (idx + 1 < instLiveVars.size()) {
      tmp = instLiveVars[idx + 1];
    }
    int size_before = instLiveVars[idx]->size();
    auto useVars = block.inst[idx]->useVars();
    auto defvar = block.inst[idx]->dest;
    // if (ignore_global_and_array) {
    //   useVars = filter_vars(useVars, vartable);
    // }
    VariableSet defvars;
    if (vartable[defvar.id].ty->kind() != mir::types::TyKind::Void &&
        block.inst[idx]->inst_kind() != mir::inst::InstKind::Store) {
      defvars.insert(defvar);
      this->defvars->insert(defvar);
    }
    if (strict) {
      if (block.inst.at(idx)->inst_kind() == mir::inst::InstKind::Phi) {
        // for (auto iter = useVars.begin(); iter != useVars.end(); iter++) {
        //   if (this->defvars->count(*iter)) {
        //     useVars.erase(iter);
        //     break;
        //   }
        // }
        useVars.clear();
        defvars.clear();
      }
    }

    VariableSet diff_result;
    instLiveVars[idx]->clear();
    std::set_difference(tmp->begin(), tmp->end(), defvars.begin(),
                        defvars.end(),
                        std::inserter(diff_result, diff_result.begin()));
    std::set_union(
        useVars.begin(), useVars.end(), diff_result.begin(), diff_result.end(),
        std::inserter(*instLiveVars[idx], instLiveVars[idx]->begin()));
  }